

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseClient.cpp
# Opt level: O3

bool __thiscall
xmrig::BaseClient::handleResponse(BaseClient *this,int64_t id,Value *result,Value *error)

{
  bool bVar1;
  _Base_ptr p_Var2;
  long lVar3;
  _Base_ptr p_Var4;
  undefined8 extraout_RDX;
  _Rb_tree_header *p_Var5;
  undefined8 in_R8;
  undefined8 in_R9;
  iterator __position;
  iterator __position_00;
  map<long,_xmrig::BaseClient::SendResult,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::BaseClient::SendResult>_>_>
  *this_00;
  undefined1 local_29;
  long local_28;
  
  if ((id != 1) &&
     (p_Var2 = (this->m_callbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var2 != (_Base_ptr)0x0)) {
    this_00 = &this->m_callbacks;
    p_Var5 = &(this->m_callbacks)._M_t._M_impl.super__Rb_tree_header;
    __position_00._M_node = &p_Var5->_M_header;
    do {
      if (id <= *(long *)(p_Var2 + 1)) {
        __position_00._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(long *)(p_Var2 + 1) < id];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position_00._M_node != p_Var5) &&
       (*(long *)(__position_00._M_node + 1) <= id)) {
      lVar3 = std::chrono::_V2::steady_clock::now();
      local_28 = lVar3 / 1000000 - (long)__position_00._M_node[2]._M_parent;
      local_29 = (error->data_).f.flags != 3;
      if ((bool)local_29) {
        p_Var2 = __position_00._M_node[1]._M_right;
        error = result;
      }
      else {
        p_Var2 = __position_00._M_node[1]._M_right;
      }
      if (p_Var2 != (_Base_ptr)0x0) {
        (**(code **)(__position_00._M_node + 2))
                  (&__position_00._M_node[1]._M_parent,error,&local_29,&local_28);
        std::
        _Rb_tree<long,std::pair<long_const,xmrig::BaseClient::SendResult>,std::_Select1st<std::pair<long_const,xmrig::BaseClient::SendResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::BaseClient::SendResult>>>
        ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,xmrig::BaseClient::SendResult>,std::_Select1st<std::pair<long_const,xmrig::BaseClient::SendResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::BaseClient::SendResult>>>
                            *)this_00,__position_00);
        return true;
      }
      std::__throw_bad_function_call();
      p_Var4 = *(_Base_ptr *)(p_Var5 + 0xe);
      if (p_Var4 == (_Base_ptr)0x0) {
        return false;
      }
      __position._M_node = (_Base_ptr)((long)(p_Var5 + 0xd) + 0x20);
      do {
        if (id <= *(long *)(p_Var4 + 1)) {
          __position._M_node = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[*(long *)(p_Var4 + 1) < id];
      } while (p_Var4 != (_Base_ptr)0x0);
      if ((__position._M_node == (_Base_ptr)((long)(p_Var5 + 0xd) + 0x20)) ||
         (id < *(long *)(__position._M_node + 1))) {
        bVar1 = false;
      }
      else {
        lVar3 = std::chrono::_V2::steady_clock::now();
        __position._M_node[2]._M_left =
             (_Base_ptr)(lVar3 / 1000000 - (long)__position._M_node[2]._M_right);
        p_Var2 = (p_Var5->_M_header)._M_left;
        (**(code **)(*(long *)p_Var2 + 0x30))
                  (p_Var2,p_Var5,&__position._M_node[1]._M_parent,extraout_RDX,in_R8,in_R9,this_00,
                   result);
        std::
        _Rb_tree<long,std::pair<long_const,xmrig::SubmitResult>,std::_Select1st<std::pair<long_const,xmrig::SubmitResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::SubmitResult>>>
        ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,xmrig::SubmitResult>,std::_Select1st<std::pair<long_const,xmrig::SubmitResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::SubmitResult>>>
                            *)((long)(p_Var5 + 0xd) + 0x18),__position);
        bVar1 = true;
      }
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool xmrig::BaseClient::handleResponse(int64_t id, const rapidjson::Value &result, const rapidjson::Value &error)
{
    if (id == 1) {
        return false;
    }

    auto it = m_callbacks.find(id);
    if (it != m_callbacks.end()) {
        const uint64_t elapsed = Chrono::steadyMSecs() - it->second.ts;

        if (error.IsObject()) {
            it->second.callback(error, false, elapsed);
        }
        else {
            it->second.callback(result, true, elapsed);
        }

        m_callbacks.erase(it);

        return true;
    }

    return false;
}